

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_hex_enum_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x6865783200000000) {
    if ((uVar1 & 0xffffffff00000000) != 0x6865783100000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 3;
    *value_sign = 0;
  }
  else if ((uVar1 & 0xffffffffffff0000) == 0x6865786e65670000) {
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,6,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0xfffffffffffffffe;
    *value_sign = 1;
  }
  else {
    if ((uVar1 & 0xffffffff00000000) != 0x6865783200000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,4,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 0x7eafbeaf;
    *value_sign = 0;
  }
  return end_local;
}

Assistant:

static const char *MyGame_Example_hex_enum_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x6865783200000000) { /* branch "hex2" */
        if ((w & 0xffffffff00000000) == 0x6865783100000000) { /* "hex1" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(3), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "hex1" */
            return unmatched;
        } /* "hex1" */
    } else { /* branch "hex2" */
        if ((w & 0xffffffffffff0000) == 0x6865786e65670000) { /* "hexneg" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 6, aggregate);
            if (buf != mark) {
                *value = UINT64_C(18446744073709551614), *value_sign = 1;
            } else {
                return unmatched;
            }
        } else { /* "hexneg" */
            if ((w & 0xffffffff00000000) == 0x6865783200000000) { /* "hex2" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(2125446831), *value_sign = 0;
                } else {
                    return unmatched;
                }
            } else { /* "hex2" */
                return unmatched;
            } /* "hex2" */
        } /* "hexneg" */
    } /* branch "hex2" */
    return buf;
}